

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O3

void std::allocator_traits<std::allocator<glcts::(anonymous_namespace)::Uniform>>::
     construct<glcts::(anonymous_namespace)::Uniform,glcts::(anonymous_namespace)::Uniform>
               (allocator_type *__a,Uniform *__p,Uniform *__args)

{
  pointer pcVar1;
  pair<int,_int> pVar2;
  pointer piVar3;
  pointer pUVar4;
  undefined8 uVar5;
  pointer pfVar6;
  pointer pUVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  
  *(GLenum *)__a = (__p->type).enumType;
  piVar3 = (__p->type).arraySizesSegmented.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  *(pointer *)(__a + 8) =
       (__p->type).arraySizesSegmented.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start;
  *(pointer *)(__a + 0x10) = piVar3;
  *(pointer *)(__a + 0x18) =
       (__p->type).arraySizesSegmented.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (__p->type).arraySizesSegmented.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__p->type).arraySizesSegmented.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__p->type).arraySizesSegmented.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(int *)(__a + 0x20) = (__p->type).arraySize;
  pUVar4 = (__p->type).childTypes.
           super__Vector_base<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)(__a + 0x28) =
       (__p->type).childTypes.
       super__Vector_base<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
       ._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)(__a + 0x30) = pUVar4;
  *(pointer *)(__a + 0x38) =
       (__p->type).childTypes.
       super__Vector_base<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (__p->type).childTypes.
  super__Vector_base<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__p->type).childTypes.
  super__Vector_base<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__p->type).childTypes.
  super__Vector_base<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(allocator_type **)(__a + 0x40) = __a + 0x50;
  pcVar1 = (__p->type).strType._M_dataplus._M_p;
  paVar8 = &(__p->type).strType.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 == paVar8) {
    uVar5 = *(undefined8 *)((long)&(__p->type).strType.field_2 + 8);
    *(size_type *)(__a + 0x50) = paVar8->_M_allocated_capacity;
    *(undefined8 *)(__a + 0x58) = uVar5;
  }
  else {
    *(pointer *)(__a + 0x40) = pcVar1;
    *(size_type *)(__a + 0x50) = paVar8->_M_allocated_capacity;
  }
  *(size_type *)(__a + 0x48) = (__p->type).strType._M_string_length;
  (__p->type).strType._M_dataplus._M_p = (pointer)paVar8;
  (__p->type).strType._M_string_length = 0;
  (__p->type).strType.field_2._M_local_buf[0] = '\0';
  *(allocator_type **)(__a + 0x60) = __a + 0x70;
  pcVar1 = (__p->type).refStrType._M_dataplus._M_p;
  paVar8 = &(__p->type).refStrType.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 == paVar8) {
    uVar5 = *(undefined8 *)((long)&(__p->type).refStrType.field_2 + 8);
    *(size_type *)(__a + 0x70) = paVar8->_M_allocated_capacity;
    *(undefined8 *)(__a + 0x78) = uVar5;
  }
  else {
    *(pointer *)(__a + 0x60) = pcVar1;
    *(size_type *)(__a + 0x70) = paVar8->_M_allocated_capacity;
  }
  *(size_type *)(__a + 0x68) = (__p->type).refStrType._M_string_length;
  (__p->type).refStrType._M_dataplus._M_p = (pointer)paVar8;
  (__p->type).refStrType._M_string_length = 0;
  (__p->type).refStrType.field_2._M_local_buf[0] = '\0';
  pVar2 = (__p->type).size;
  *(undefined8 *)(__a + 0x86) = *(undefined8 *)((long)&(__p->type).size.second + 2);
  *(pair<int,_int> *)(__a + 0x80) = pVar2;
  *(DefOccurenceEnum *)(__a + 0xa0) = (__p->usageOccurence).occurence;
  uVar5 = *(undefined8 *)&(__p->location).super_LayoutSpecifierBase.occurence;
  *(undefined8 *)(__a + 0x90) = *(undefined8 *)&(__p->location).super_LayoutSpecifierBase;
  *(undefined8 *)(__a + 0x98) = uVar5;
  pfVar6 = (__p->value).fValues.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
  *(pointer *)(__a + 0xa8) =
       (__p->value).fValues.super__Vector_base<float,_std::allocator<float>_>._M_impl.
       super__Vector_impl_data._M_start;
  *(pointer *)(__a + 0xb0) = pfVar6;
  *(pointer *)(__a + 0xb8) =
       (__p->value).fValues.super__Vector_base<float,_std::allocator<float>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (__p->value).fValues.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__p->value).fValues.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__p->value).fValues.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  piVar3 = (__p->value).iValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  *(pointer *)(__a + 0xc0) =
       (__p->value).iValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start;
  *(pointer *)(__a + 200) = piVar3;
  *(pointer *)(__a + 0xd0) =
       (__p->value).iValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (__p->value).iValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  (__p->value).iValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (__p->value).iValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  piVar3 = (__p->value).uValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  *(pointer *)(__a + 0xd8) =
       (__p->value).uValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start;
  *(pointer *)(__a + 0xe0) = piVar3;
  *(pointer *)(__a + 0xe8) =
       (__p->value).uValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (__p->value).uValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  (__p->value).uValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (__p->value).uValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  *(GLenum *)(__a + 0xf0) = (__p->value).type.enumType;
  piVar3 = (__p->value).type.arraySizesSegmented.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)(__a + 0xf8) =
       (__p->value).type.arraySizesSegmented.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start;
  *(pointer *)(__a + 0x100) = piVar3;
  *(pointer *)(__a + 0x108) =
       (__p->value).type.arraySizesSegmented.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (__p->value).type.arraySizesSegmented.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__p->value).type.arraySizesSegmented.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__p->value).type.arraySizesSegmented.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(int *)(__a + 0x110) = (__p->value).type.arraySize;
  pUVar4 = (__p->value).type.childTypes.
           super__Vector_base<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)(__a + 0x118) =
       (__p->value).type.childTypes.
       super__Vector_base<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
       ._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)(__a + 0x120) = pUVar4;
  *(pointer *)(__a + 0x128) =
       (__p->value).type.childTypes.
       super__Vector_base<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (__p->value).type.childTypes.
  super__Vector_base<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__p->value).type.childTypes.
  super__Vector_base<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__p->value).type.childTypes.
  super__Vector_base<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(allocator_type **)(__a + 0x130) = __a + 0x140;
  pcVar1 = (__p->value).type.strType._M_dataplus._M_p;
  paVar8 = &(__p->value).type.strType.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 == paVar8) {
    uVar5 = *(undefined8 *)((long)&(__p->value).type.strType.field_2 + 8);
    *(size_type *)(__a + 0x140) = paVar8->_M_allocated_capacity;
    *(undefined8 *)(__a + 0x148) = uVar5;
  }
  else {
    *(pointer *)(__a + 0x130) = pcVar1;
    *(size_type *)(__a + 0x140) = paVar8->_M_allocated_capacity;
  }
  *(size_type *)(__a + 0x138) = (__p->value).type.strType._M_string_length;
  (__p->value).type.strType._M_dataplus._M_p = (pointer)paVar8;
  (__p->value).type.strType._M_string_length = 0;
  (__p->value).type.strType.field_2._M_local_buf[0] = '\0';
  *(allocator_type **)(__a + 0x150) = __a + 0x160;
  pcVar1 = (__p->value).type.refStrType._M_dataplus._M_p;
  paVar8 = &(__p->value).type.refStrType.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 == paVar8) {
    uVar5 = *(undefined8 *)((long)&(__p->value).type.refStrType.field_2 + 8);
    *(size_type *)(__a + 0x160) = paVar8->_M_allocated_capacity;
    *(undefined8 *)(__a + 0x168) = uVar5;
  }
  else {
    *(pointer *)(__a + 0x150) = pcVar1;
    *(size_type *)(__a + 0x160) = paVar8->_M_allocated_capacity;
  }
  *(size_type *)(__a + 0x158) = (__p->value).type.refStrType._M_string_length;
  (__p->value).type.refStrType._M_dataplus._M_p = (pointer)paVar8;
  (__p->value).type.refStrType._M_string_length = 0;
  (__p->value).type.refStrType.field_2._M_local_buf[0] = '\0';
  pVar2 = (__p->value).type.size;
  *(undefined8 *)(__a + 0x176) = *(undefined8 *)((long)&(__p->value).type.size.second + 2);
  *(pair<int,_int> *)(__a + 0x170) = pVar2;
  pUVar7 = (__p->childUniforms).
           super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)(__a + 0x180) =
       (__p->childUniforms).
       super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
       ._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)(__a + 0x188) = pUVar7;
  *(pointer *)(__a + 400) =
       (__p->childUniforms).
       super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (__p->childUniforms).
  super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__p->childUniforms).
  super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__p->childUniforms).
  super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(allocator_type **)(__a + 0x198) = __a + 0x1a8;
  pcVar1 = (__p->name)._M_dataplus._M_p;
  paVar8 = &(__p->name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 == paVar8) {
    uVar5 = *(undefined8 *)((long)&(__p->name).field_2 + 8);
    *(size_type *)(__a + 0x1a8) = paVar8->_M_allocated_capacity;
    *(undefined8 *)(__a + 0x1b0) = uVar5;
  }
  else {
    *(pointer *)(__a + 0x198) = pcVar1;
    *(size_type *)(__a + 0x1a8) = paVar8->_M_allocated_capacity;
  }
  *(size_type *)(__a + 0x1a0) = (__p->name)._M_string_length;
  (__p->name)._M_dataplus._M_p = (pointer)paVar8;
  (__p->name)._M_string_length = 0;
  (__p->name).field_2._M_local_buf[0] = '\0';
  *(allocator_type **)(__a + 0x1b8) = __a + 0x1c8;
  pcVar1 = (__p->shortName)._M_dataplus._M_p;
  paVar8 = &(__p->shortName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 == paVar8) {
    uVar5 = *(undefined8 *)((long)&(__p->shortName).field_2 + 8);
    *(size_type *)(__a + 0x1c8) = paVar8->_M_allocated_capacity;
    *(undefined8 *)(__a + 0x1d0) = uVar5;
  }
  else {
    *(pointer *)(__a + 0x1b8) = pcVar1;
    *(size_type *)(__a + 0x1c8) = paVar8->_M_allocated_capacity;
  }
  *(size_type *)(__a + 0x1c0) = (__p->shortName)._M_string_length;
  (__p->shortName)._M_dataplus._M_p = (pointer)paVar8;
  (__p->shortName)._M_string_length = 0;
  (__p->shortName).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

UniformType(GLenum _enumType, int _arraySize = 0)
		: enumType(_enumType), arraySize(_arraySize), isArray(_arraySize > 0), signedType(true)
	{
		if (!arraySize)
		{
			arraySize = 1;
		}
		arraySizesSegmented.push_back(arraySize);
		fill();
	}